

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

const_iterator * __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::begin
          (IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U> *this)

{
  const_iterator *in_RDI;
  const_iterator *it;
  const_iterator *this_00;
  
  this_00 = in_RDI;
  const_iterator::const_iterator
            (in_RDI,(IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U> *)in_RDI);
  const_iterator::setToBegin(this_00);
  return in_RDI;
}

Assistant:

const_iterator begin() const {
        const_iterator it(*this);
        it.setToBegin();
        return it;
    }